

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O3

bool __thiscall QtWidgetsShortcutPrivate::handleWhatsThis(QtWidgetsShortcutPrivate *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QWhatsThis::inWhatsThisMode();
  if (bVar1) {
    local_20 = (QPoint)QCursor::pos();
    QWhatsThis::showText(&local_20,(QString *)&this->field_0x90,(QWidget *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QtWidgetsShortcutPrivate::handleWhatsThis()
{
#if QT_CONFIG(whatsthis)
    if (QWhatsThis::inWhatsThisMode()) {
        QWhatsThis::showText(QCursor::pos(), sc_whatsthis);
        return true;
    }
#endif
    return false;
}